

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O2

ma_result ma_result_from_pulse(wchar_t result)

{
  if ((uint)result < 6) {
    return *(ma_result *)(&DAT_001ae1f8 + (ulong)(uint)result * 4);
  }
  return MA_ERROR;
}

Assistant:

static ma_result ma_result_from_pulse(int result)
{
    if (result < 0) {
        return MA_ERROR;
    }

    switch (result) {
        case MA_PA_OK:           return MA_SUCCESS;
        case MA_PA_ERR_ACCESS:   return MA_ACCESS_DENIED;
        case MA_PA_ERR_INVALID:  return MA_INVALID_ARGS;
        case MA_PA_ERR_NOENTITY: return MA_NO_DEVICE;
        default:                 return MA_ERROR;
    }
}